

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,
                lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *R)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *d;
  void *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  ignore_spaces_cl *in_stack_ffffffffffffef98;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffefc0;
  undefined1 local_1014 [4076];
  status_type *in_stack_ffffffffffffffd8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  
  lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::status_type::status_type
            ((status_type *)local_1014);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = in_RDI + *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  utility::ignore_spaces();
  utility::operator>>(this,in_stack_ffffffffffffef98);
  utility::delim('\0');
  d = utility::operator>>(this,(delim_c *)in_stack_ffffffffffffef98);
  lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::name();
  utility::delim((char *)in_stack_ffffffffffffef98);
  utility::operator>>(in_stack_ffffffffffffefc0,(delim_str *)d);
  utility::delim('\0');
  utility::operator>>(this,(delim_c *)in_stack_ffffffffffffef98);
  operator>>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  utility::delim('\0');
  utility::operator>>(this,(delim_c *)in_stack_ffffffffffffef98);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  if (bVar1) {
    memcpy(in_RSI,local_1014,0x1004);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return in_RDI;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, lagfib4xor &R) {
      typename lagfib4xor::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(lagfib4xor::name()) >> utility::delim(' ') >>
          S_new >> utility::delim(']');
      if (in)
        R.S = S_new;
      in.flags(flags);
      return in;
    }